

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

void __thiscall NaVector::NaVector(NaVector *this,uint n)

{
  NaReal *pNVar1;
  
  this->_vptr_NaVector = (_func_int **)&PTR__NaVector_00177ae0;
  this->bOwnStorage = true;
  pNVar1 = (NaReal *)operator_new__((ulong)n << 3);
  this->pVect = pNVar1;
  this->nDim = n;
  init_value(this,0.0);
  return;
}

Assistant:

NaVector::NaVector (unsigned n)
{
    // Create the vector
    bOwnStorage = true;
    pVect = new NaReal[n];
    nDim = n;

    // Initialize items by zero
    init_zero();
}